

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  add_thousands_sep<wchar_t> sep;
  wchar_t *pwVar1;
  uint uStack_c;
  
  sep.sep_.size_ = 1;
  sep.sep_.data_ = (wchar_t *)(this + 8);
  sep._16_8_ = (ulong)uStack_c << 0x20;
  pwVar1 = internal::
           format_decimal<wchar_t,unsigned_int,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (*it,*(uint *)this,*(int *)(this + 4),sep);
  *it = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }